

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_uint * nk_find_value(nk_window *win,nk_hash name)

{
  ushort local_2a;
  nk_table *pnStack_28;
  nk_ushort i;
  nk_table *iter;
  nk_ushort size;
  nk_hash name_local;
  nk_window *win_local;
  
  iter._2_2_ = win->table_size;
  pnStack_28 = win->tables;
  do {
    if (pnStack_28 == (nk_table *)0x0) {
      return (nk_uint *)0x0;
    }
    for (local_2a = 0; local_2a < iter._2_2_; local_2a = local_2a + 1) {
      if (pnStack_28->keys[local_2a] == name) {
        pnStack_28->seq = win->seq;
        return pnStack_28->values + local_2a;
      }
    }
    iter._2_2_ = 0x35;
    pnStack_28 = pnStack_28->next;
  } while( true );
}

Assistant:

NK_INTERN nk_uint*
nk_find_value(struct nk_window *win, nk_hash name)
{
    nk_ushort size = win->table_size;
    struct nk_table *iter = win->tables;
    while (iter) {
        nk_ushort i = 0;
        for (i = 0; i < size; ++i) {
            if (iter->keys[i] == name) {
                iter->seq = win->seq;
                return &iter->values[i];
            }
        }
        size = NK_VALUE_PAGE_CAPACITY;
        iter = iter->next;
    }
    return 0;
}